

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rest.cpp
# Opt level: O2

bool rest_deploymentinfo(any *context,HTTPRequest *req,string *str_uri_part)

{
  long lVar1;
  UniValue val;
  bool bVar2;
  RESTResponseFormat RVar3;
  ChainstateManager *pCVar4;
  CBlockIndex *pCVar5;
  char *in_RCX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  long in_FS_OFFSET;
  string_view str;
  string in_stack_fffffffffffffc28;
  undefined1 auStack_3b8 [8];
  optional<uint256> hash;
  undefined1 auStack_38f [15];
  UniValue local_2f8;
  undefined1 local_2a0 [32];
  span<const_std::byte,_18446744073709551615UL> local_280;
  UniValue local_260;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  undefined1 *local_1c8;
  undefined8 local_1c0;
  undefined1 local_1b8 [16];
  JSONRPCRequest jsonRequest;
  string hash_str;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CheckWarmup(req);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_007cd24b;
  }
  hash_str._M_dataplus._M_p = (pointer)&hash_str.field_2;
  hash_str._M_string_length = 0;
  hash_str.field_2._M_local_buf[0] = '\0';
  RVar3 = ParseDataFormat(&hash_str,str_uri_part);
  if (RVar3 == JSON) {
    JSONRPCRequest::JSONRPCRequest(&jsonRequest);
    std::any::operator=(&jsonRequest.context,context);
    local_1c8 = local_1b8;
    local_1c0 = 0;
    local_1b8[0] = 0;
    UniValue::UniValue((UniValue *)&hash,VARR,in_stack_fffffffffffffc28);
    UniValue::operator=(&jsonRequest.params,(UniValue *)&hash);
    UniValue::~UniValue((UniValue *)&hash);
    std::__cxx11::string::~string((string *)&local_1c8);
    if (hash_str._M_string_length == 0) {
LAB_007cd0a2:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&hash,"Content-Type",(allocator<char> *)(local_2a0 + 0x20));
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2f8,"application/json",(allocator<char> *)local_2a0);
      HTTPRequest::WriteHeader(req,(string *)&hash,(string *)&local_2f8);
      std::__cxx11::string::~string((string *)&local_2f8);
      std::__cxx11::string::~string((string *)&hash);
      getdeploymentinfo();
      RPCHelpMan::HandleRequest(&local_2f8,(RPCHelpMan *)&hash,&jsonRequest);
      UniValue::write_abi_cxx11_((UniValue *)local_2a0,(int)&local_2f8,(void *)0x0,0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_2a0 + 0x20),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a0,
                     "\n");
      HTTPRequest::WriteReply(req,200,local_280);
      std::__cxx11::string::~string((string *)(local_2a0 + 0x20));
      std::__cxx11::string::~string((string *)local_2a0);
      UniValue::~UniValue(&local_2f8);
      RPCHelpMan::~RPCHelpMan((RPCHelpMan *)&hash);
      bVar2 = true;
    }
    else {
      str._M_str = in_RCX;
      str._M_len = (size_t)hash_str._M_dataplus._M_p;
      detail::FromHex<uint256>(&hash,(detail *)hash_str._M_string_length,str);
      if (hash.super__Optional_base<uint256,_true,_true>._M_payload.
          super__Optional_payload_base<uint256>._M_engaged == false) {
        std::operator+(&local_1e8,"Invalid hash: ",&hash_str);
        RESTERR(req,HTTP_BAD_REQUEST,&local_1e8);
        this = &local_1e8;
LAB_007cd22a:
        std::__cxx11::string::~string((string *)this);
      }
      else {
        pCVar4 = GetChainman(context,req);
        if (pCVar4 != (ChainstateManager *)0x0) {
          UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                    ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)&local_2f8,&cs_main,
                     "::cs_main",
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rest.cpp"
                     ,0x277,false);
          pCVar5 = node::BlockManager::LookupBlockIndex(&pCVar4->m_blockman,(uint256 *)&hash);
          std::unique_lock<std::recursive_mutex>::~unique_lock
                    ((unique_lock<std::recursive_mutex> *)&local_2f8);
          if (pCVar5 != (CBlockIndex *)0x0) {
            UniValue::
            UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                      ((UniValue *)(local_2a0 + 0x40),&hash_str);
            val._32_40_ = _auStack_3b8;
            val._0_32_ = in_stack_fffffffffffffc28;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._M_finish._0_1_ =
                 hash.super__Optional_base<uint256,_true,_true>._M_payload.
                 super__Optional_payload_base<uint256>._M_engaged;
            val.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
            super__Vector_impl_data._9_15_ = auStack_38f;
            UniValue::push_back(&jsonRequest.params,val);
            UniValue::~UniValue((UniValue *)(local_2a0 + 0x40));
            goto LAB_007cd0a2;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_208,"Block not found",(allocator<char> *)&local_2f8);
          RESTERR(req,HTTP_BAD_REQUEST,&local_208);
          this = &local_208;
          goto LAB_007cd22a;
        }
      }
      bVar2 = false;
    }
    JSONRPCRequest::~JSONRPCRequest(&jsonRequest);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffffc30,"output format not found (available: json)",
               (allocator<char> *)&jsonRequest);
    RESTERR(req,HTTP_NOT_FOUND,(string *)&stack0xfffffffffffffc30);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffc30);
    bVar2 = false;
  }
  std::__cxx11::string::~string((string *)&hash_str);
LAB_007cd24b:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool rest_deploymentinfo(const std::any& context, HTTPRequest* req, const std::string& str_uri_part)
{
    if (!CheckWarmup(req)) return false;

    std::string hash_str;
    const RESTResponseFormat rf = ParseDataFormat(hash_str, str_uri_part);

    switch (rf) {
    case RESTResponseFormat::JSON: {
        JSONRPCRequest jsonRequest;
        jsonRequest.context = context;
        jsonRequest.params = UniValue(UniValue::VARR);

        if (!hash_str.empty()) {
            auto hash{uint256::FromHex(hash_str)};
            if (!hash) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Invalid hash: " + hash_str);
            }

            const ChainstateManager* chainman = GetChainman(context, req);
            if (!chainman) return false;
            if (!WITH_LOCK(::cs_main, return chainman->m_blockman.LookupBlockIndex(*hash))) {
                return RESTERR(req, HTTP_BAD_REQUEST, "Block not found");
            }

            jsonRequest.params.push_back(hash_str);
        }

        req->WriteHeader("Content-Type", "application/json");
        req->WriteReply(HTTP_OK, getdeploymentinfo().HandleRequest(jsonRequest).write() + "\n");
        return true;
    }
    default: {
        return RESTERR(req, HTTP_NOT_FOUND, "output format not found (available: json)");
    }
    }

}